

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::EventMeta::midiMessage(EventMeta *this)

{
  initializer_list<unsigned_char> __l;
  iterator this_00;
  const_iterator __position;
  const_iterator __first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  allocator_type *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> s;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffef8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff00;
  allocator_type *paVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff48;
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b;
  undefined1 local_11;
  
  local_11 = 0;
  local_2b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = 0xff;
  local_2b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ =
       *(undefined1 *)
        &(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  local_2b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._3_8_ =
       (long)&local_2b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  local_2b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._11_8_ = 2;
  this_01 = &local_2b;
  paVar1 = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1152f9);
  __l._M_len = (size_type)this_01;
  __l._M_array = (iterator)paVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_RSI,__l,in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x115327);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  inner::getVariableValue((uint64_t)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffef8._M_current);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffef8._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffef8._M_current);
  std::
  make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_fffffffffffffef8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffef8._M_current);
  std::
  make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_fffffffffffffef8);
  this_00 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                      (this_01,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffef8._M_current);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffef8._M_current);
  __position = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         (in_stack_fffffffffffffef8._M_current);
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      (in_stack_fffffffffffffef8._M_current);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            (this_01,__position,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )in_stack_ffffffffffffff48._M_current._M_current);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

virtual std::vector<uint8_t> midiMessage() const {
			std::vector<uint8_t> v{
				statusByte,
				static_cast<uint8_t>(type),
			};
			{// データサイズ
				std::vector<uint8_t> s = inner::getVariableValue(data.size());
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}
			v.insert(v.end(), data.begin(), data.end());	// データ
			return v;
		}